

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BOOLEAN.c
# Opt level: O0

asn_dec_rval_t
BOOLEAN_decode_uper(asn_codec_ctx_t *opt_codec_ctx,asn_TYPE_descriptor_t *td,
                   asn_per_constraints_t *constraints,void **sptr,asn_per_data_t *pd)

{
  int32_t iVar1;
  undefined8 *in_RCX;
  char *pcVar2;
  undefined8 *in_RSI;
  asn_dec_rval_t aVar3;
  BOOLEAN_t *st;
  asn_dec_rval_t rv;
  asn_dec_rval_t tmp_error;
  char *local_58;
  int *local_50;
  undefined8 local_10;
  size_t local_8;
  
  local_50 = (int *)*in_RCX;
  if (local_50 == (int *)0x0) {
    local_50 = (int *)malloc(4);
    *in_RCX = local_50;
    if (local_50 == (int *)0x0) {
      local_10 = 2;
      local_8 = 0;
      if (in_RSI == (undefined8 *)0x0) {
        local_58 = "";
      }
      else {
        local_58 = (char *)*in_RSI;
      }
      ASN_DEBUG("Failed to decode element %s",local_58);
      goto LAB_0014ea4c;
    }
  }
  iVar1 = per_get_few_bits((asn_per_data_t *)constraints,sptr._4_4_);
  if (iVar1 == -1) {
LAB_0014e9e2:
    local_10 = 1;
    local_8 = 0;
  }
  else {
    if (iVar1 == 0) {
      *local_50 = 0;
    }
    else {
      if (iVar1 != 1) goto LAB_0014e9e2;
      *local_50 = 1;
    }
    pcVar2 = "FALSE";
    if (*local_50 != 0) {
      pcVar2 = "TRUE";
    }
    ASN_DEBUG("%s decoded as %s",*in_RSI,pcVar2);
    local_10 = 0;
    local_8 = 1;
  }
LAB_0014ea4c:
  aVar3.consumed = local_8;
  aVar3._0_8_ = local_10;
  return aVar3;
}

Assistant:

asn_dec_rval_t
BOOLEAN_decode_uper(asn_codec_ctx_t *opt_codec_ctx, asn_TYPE_descriptor_t *td,
	asn_per_constraints_t *constraints, void **sptr, asn_per_data_t *pd) {
	asn_dec_rval_t rv;
	BOOLEAN_t *st = (BOOLEAN_t *)*sptr;

	(void)opt_codec_ctx;
	(void)constraints;

	if(!st) {
		st = (BOOLEAN_t *)(*sptr = MALLOC(sizeof(*st)));
		if(!st) ASN__DECODE_FAILED;
	}

	/*
	 * Extract a single bit
	 */
	switch(per_get_few_bits(pd, 1)) {
	case 1: *st = 1; break;
	case 0: *st = 0; break;
	case -1: default: ASN__DECODE_STARVED;
	}

	ASN_DEBUG("%s decoded as %s", td->name, *st ? "TRUE" : "FALSE");

	rv.code = RC_OK;
	rv.consumed = 1;
	return rv;
}